

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCursor(Btree *p,Pgno iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  BtCursor *pCur_local;
  KeyInfo *pKeyInfo_local;
  int wrFlag_local;
  Pgno iTable_local;
  Btree *p_local;
  
  if (p->sharable == '\0') {
    p_local._4_4_ = btreeCursor(p,iTable,wrFlag,pKeyInfo,pCur);
  }
  else {
    p_local._4_4_ = btreeCursorWithLock(p,iTable,wrFlag,pKeyInfo,pCur);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  Pgno iTable,                                /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  if( p->sharable ){
    return btreeCursorWithLock(p, iTable, wrFlag, pKeyInfo, pCur);
  }else{
    return btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
  }
}